

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O3

zlib_filefunc_def *
Assimp::IOSystem2Unzip::get(zlib_filefunc_def *__return_storage_ptr__,IOSystem *pIOHandler)

{
  __return_storage_ptr__->zopen_file = open;
  __return_storage_ptr__->zread_file = read;
  __return_storage_ptr__->zwrite_file = write;
  __return_storage_ptr__->ztell_file = tell;
  __return_storage_ptr__->zseek_file = seek;
  __return_storage_ptr__->zclose_file = close;
  __return_storage_ptr__->zerror_file = testerror;
  __return_storage_ptr__->opaque = pIOHandler;
  return __return_storage_ptr__;
}

Assistant:

zlib_filefunc_def IOSystem2Unzip::get(IOSystem* pIOHandler) {
        zlib_filefunc_def mapping;

#ifdef ASSIMP_USE_HUNTER
        mapping.zopen_file = (open_file_func)open;
        mapping.zread_file = (read_file_func)read;
        mapping.zwrite_file = (write_file_func)write;
        mapping.ztell_file = (tell_file_func)tell;
        mapping.zseek_file = (seek_file_func)seek;
        mapping.zclose_file = (close_file_func)close;
        mapping.zerror_file = (error_file_func)testerror;
#else
        mapping.zopen_file = open;
        mapping.zread_file = read;
        mapping.zwrite_file = write;
        mapping.ztell_file = tell;
        mapping.zseek_file = seek;
        mapping.zclose_file = close;
        mapping.zerror_file = testerror;
#endif
        mapping.opaque = reinterpret_cast<voidpf>(pIOHandler);

        return mapping;
    }